

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_CallAsmInternalCommon
          (InterpreterStackFrame *this,ScriptFunction *function,RegSlot returnReg)

{
  ScriptContext *scriptContext;
  _func_void_ptr_RecyclableObject_ptr_CallInfo____ *p_Var1;
  InterpreterStackFrame *pIVar2;
  code *pcVar3;
  InterpreterStackFrame *pIVar4;
  bool bVar5;
  Which WVar6;
  RegSlot RVar7;
  RegSlot RVar8;
  int iVar9;
  AsmJsScriptFunction *this_00;
  FunctionBody *this_01;
  void *pvVar10;
  ProxyEntryPointInfo *pPVar11;
  undefined4 *puVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  double dVar16;
  AsmJsRetType local_44;
  InterpreterStackFrame *local_40;
  RegSlot local_34;
  
  local_40 = this;
  local_34 = returnReg;
  this_00 = VarTo<Js::AsmJsScriptFunction,Js::ScriptFunction>(function);
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
  pvVar10 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,AsmJsFunctionInfo);
  uVar14 = *(ushort *)((long)pvVar10 + 0x80) + 0xf & 0xfffffff0;
  scriptContext =
       (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  pPVar11 = ScriptFunction::GetEntryPointInfo(function);
  ThreadContext::ProbeStack
            (scriptContext->threadContext,(ulong)uVar14 + 0xc00,(RecyclableObject *)function,
             scriptContext);
  p_Var1 = (_func_void_ptr_RecyclableObject_ptr_CallInfo____ *)pPVar11->jsMethod;
  local_44.which_ = *(Type *)((long)pvVar10 + 0x84);
  WVar6 = AsmJsRetType::which(&local_44);
  pIVar2 = local_40;
  switch(WVar6) {
  case Int64:
    lVar13 = JavascriptFunction::CallAsmJsFunction<long>
                       ((RecyclableObject *)function,p_Var1,*(void ***)(local_40 + 0x28),uVar14,
                        (uchar *)0x0);
    *(long *)(*(long *)(pIVar2 + 0x120) + (ulong)local_34 * 8) = lVar13;
    break;
  case Double:
    dVar16 = JavascriptFunction::CallAsmJsFunction<double>
                       ((RecyclableObject *)function,p_Var1,*(void ***)(local_40 + 0x28),uVar14,
                        (uchar *)0x0);
    *(double *)(*(long *)(pIVar2 + 0x128) + (ulong)local_34 * 8) = dVar16;
    break;
  case Float:
    fVar15 = JavascriptFunction::CallAsmJsFunction<float>
                       ((RecyclableObject *)function,p_Var1,*(void ***)(local_40 + 0x28),uVar14,
                        (uchar *)0x0);
    *(float *)(*(long *)(pIVar2 + 0x130) + (ulong)local_34 * 4) = fVar15;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xf34,"((0))","(0)");
    if (!bVar5) goto LAB_00a54739;
    *puVar12 = 0;
    break;
  case Signed:
    iVar9 = JavascriptFunction::CallAsmJsFunction<int>
                      ((RecyclableObject *)function,p_Var1,*(void ***)(local_40 + 0x28),uVar14,
                       (uchar *)0x0);
    *(int *)(*(long *)(pIVar2 + 0x118) + (ulong)local_34 * 4) = iVar9;
    break;
  case Void:
    JavascriptFunction::CallAsmJsFunction<int>
              ((RecyclableObject *)function,p_Var1,*(void ***)(local_40 + 0x28),uVar14,(uchar *)0x0)
    ;
    break;
  case Int32x4:
  case Uint32x4:
  case Int16x8:
  case Int8x16:
  case Uint16x8:
  case Uint8x16:
  case Bool32x4:
  case Bool16x8:
  case Bool8x16:
  case Float32x4:
  case Float64x2:
    break;
  }
  pIVar4 = local_40;
  lVar13 = *(long *)(local_40 + 0x30) - (ulong)(*(ushort *)((long)pvVar10 + 0x80) & 0xfffffff8);
  *(long *)(local_40 + 0x30) = lVar13 + -0x10;
  *(undefined8 *)(local_40 + 0x28) = *(undefined8 *)(lVar13 + -0x10);
  RVar7 = FunctionBody::GetLocalsCount(*(FunctionBody **)(local_40 + 0x88));
  pIVar2 = *(InterpreterStackFrame **)(pIVar4 + 0x30);
  if (pIVar4 + (ulong)RVar7 * 8 + 0x160 <= pIVar2) {
    RVar7 = FunctionBody::GetLocalsCount(*(FunctionBody **)(pIVar4 + 0x88));
    RVar8 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(pIVar4 + 0x88));
    if (pIVar2 < pIVar4 + (ulong)RVar8 * 8 + (ulong)RVar7 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar12 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar5) {
    *puVar12 = 0;
    return;
  }
LAB_00a54739:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void InterpreterStackFrame::OP_CallAsmInternalCommon(ScriptFunction* function, RegSlot returnReg)
    {
        AsmJsScriptFunction* scriptFunc = VarTo<AsmJsScriptFunction>(function);
        AsmJsFunctionInfo* asmInfo = scriptFunc->GetFunctionBody()->GetAsmJsFunctionInfo();
        uint alignedArgsSize = ::Math::Align<uint32>(asmInfo->GetArgByteSize(), 16);
#if _M_X64 && _WIN32
        // convention is to always allocate spill space for rcx,rdx,r8,r9
        if (alignedArgsSize < 0x20) alignedArgsSize = 0x20;
        uint* argSizes = asmInfo->GetArgsSizesArray();
        Assert(asmInfo->GetArgSizeArrayLength() >= 2);
        byte* curOutParams = (byte*)m_outParams + sizeof(Var);
        Assert(curOutParams + argSizes[0] + argSizes[1] + 16 <= (byte*)this->m_outParamsEnd);

        // Prepare in advance the possible arguments that will need to be put in register
        byte _declspec(align(16)) reg[3 * 16];
        CompileAssert((FunctionBody::MinAsmJsOutParams() * sizeof(Var)) == (sizeof(Var) * 2 + sizeof(reg)));
        js_memcpy_s(reg, 16, curOutParams, 16);
        js_memcpy_s(reg + 16, 16, curOutParams + argSizes[0], 16);
        js_memcpy_s(reg + 32, 16, curOutParams + argSizes[0] + argSizes[1], 16);
#else
        byte* reg = nullptr;
#endif

        ScriptContext * scriptContext = function->GetScriptContext();
        Js::FunctionEntryPointInfo* entrypointInfo = (Js::FunctionEntryPointInfo*)function->GetEntryPointInfo();
        PROBE_STACK_CALL(scriptContext, function, alignedArgsSize + Js::Constants::MinStackDefault);
        // Calling the jsMethod might change the entrypoint, adding the variable here 
        // will save the method on the stack helping debug what really got called
        JavascriptMethod jsMethod = entrypointInfo->jsMethod;

        switch (asmInfo->GetReturnType().which())
        {
        case AsmJsRetType::Void:
            JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Signed:

            m_localIntSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<int>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Int64:
            m_localInt64Slots[returnReg] = JavascriptFunction::CallAsmJsFunction<int64>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Double:
            m_localDoubleSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<double>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
        case AsmJsRetType::Float:
            m_localFloatSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<float>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            break;
#ifdef ENABLE_WASM_SIMD
        case AsmJsRetType::Float32x4:
        case AsmJsRetType::Int32x4:
        case AsmJsRetType::Bool32x4:
        case AsmJsRetType::Bool16x8:
        case AsmJsRetType::Bool8x16:
        case AsmJsRetType::Float64x2:
        case AsmJsRetType::Int16x8:
        case AsmJsRetType::Int8x16:
        case AsmJsRetType::Uint32x4:
        case AsmJsRetType::Uint16x8:
        case AsmJsRetType::Uint8x16:
#if _WIN32 //WASM.SIMD ToDo: Enable thunk for Xplat
#if _M_X64
#if !defined(__clang__)
            X86SIMDValue simdVal;
            simdVal.m128_value = JavascriptFunction::CallAsmJsFunction<__m128>(function, jsMethod, m_outParams, alignedArgsSize, reg);
            m_localSimdSlots[returnReg] = X86SIMDValue::ToSIMDValue(simdVal);
#else
            AssertOrFailFastMsg(false, "This particular path causes linking issues in clang on windows; potential difference in name mangling?");
#endif // !defined(__clang__)
#else
            m_localSimdSlots[returnReg] = JavascriptFunction::CallAsmJsFunction<AsmJsSIMDValue>(function, jsMethod, m_outParams, alignedArgsSize, reg);
#endif // _M_X64
#endif // _WIN32
            break;
#endif // ENABLE_WASM_SIMD
        default:
            Assume(UNREACHED);
        }

        const ArgSlot nVarToPop = (asmInfo->GetArgByteSize() / sizeof(Var)) + 1;
        PopOut(nVarToPop);

        Assert(function);
    }